

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O3

void dlib::
     isort_array<std::__cxx11::string[29],dlib::open_file_box_helper::case_insensitive_compare>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> (*array) [29],
               unsigned_long left,unsigned_long right,case_insensitive_compare *comp)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  string *psVar4;
  string *a;
  long lVar5;
  long lVar6;
  
  if (left + 1 <= right) {
    psVar4 = *array + left;
    lVar6 = -1;
    uVar1 = left + 1;
    do {
      uVar3 = uVar1;
      bVar2 = open_file_box_helper::case_insensitive_compare::operator()
                        (comp,*array + uVar3,*array + left);
      a = psVar4;
      lVar5 = lVar6;
      while (bVar2 != false) {
        std::__cxx11::string::swap((string *)(a + 1));
        lVar5 = lVar5 + 1;
        if (lVar5 == 0) break;
        bVar2 = open_file_box_helper::case_insensitive_compare::operator()(comp,a,a + -1);
        a = a + -1;
      }
      psVar4 = psVar4 + 1;
      lVar6 = lVar6 + -1;
      uVar1 = uVar3 + 1;
      left = uVar3;
    } while (uVar3 + 1 <= right);
  }
  return;
}

Assistant:

void isort_array (
        T& array,
        const unsigned long left,
        const unsigned long right,
        const compare& comp
    )
    {
        DLIB_ASSERT (left <= right,
                "\tvoid isort_array()"
                << "\n\tleft:          " << left
                << "\n\tright:         " << right );
        using namespace sort_helpers;

        unsigned long pos;
        for (unsigned long i = left+1; i <= right; ++i)
        {
            // everything from left to i-1 is sorted.
            pos = i;
            for (unsigned long j = i-1; comp(array[pos] , array[j]); --j)
            {
                exchange(array[pos],array[j]);
                pos = j;
                
                if (j == left)
                    break;
            }
        }
    }